

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pageInsertArray(MemPage *pPg,u8 *pBegin,u8 **ppData,u8 *pCellptr,int iFirst,int nCell,
                   CellArray *pCArray)

{
  u8 *puVar1;
  u8 *__src;
  u16 uVar2;
  u8 *__dest;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ushort uVar6;
  long lVar7;
  ulong uVar8;
  int local_74;
  u8 *local_70;
  u8 *local_60;
  int rc;
  
  if (nCell < 1) {
    return 0;
  }
  puVar1 = pPg->aData;
  local_70 = *ppData;
  iVar5 = nCell + iFirst;
  uVar8 = 0;
  do {
    uVar4 = uVar8;
    if (5 < uVar4) break;
    uVar8 = uVar4 + 1;
  } while (pCArray->ixNx[uVar4] <= iFirst);
  local_74 = (int)(uVar4 + 1) + -1;
  local_60 = pCArray->apEnd[uVar4];
  lVar3 = (long)iFirst;
  while( true ) {
    lVar7 = lVar3 + 1;
    uVar2 = cachedCellSize(pCArray,iFirst);
    uVar8 = (ulong)(uint)uVar2;
    if (((puVar1[1] == '\0') && (puVar1[2] == '\0')) ||
       (__dest = pageFindSlot(pPg,(uint)uVar2,&rc), __dest == (u8 *)0x0)) {
      if ((long)local_70 - (long)pBegin < (long)uVar8) {
        return 1;
      }
      __dest = local_70 + -uVar8;
      local_70 = __dest;
    }
    __src = pCArray->apCell[lVar3];
    if ((__src < local_60) && (local_60 < __src + uVar8)) break;
    memmove(__dest,__src,uVar8);
    uVar6 = (short)__dest - (short)puVar1;
    *(ushort *)pCellptr = uVar6 * 0x100 | uVar6 >> 8;
    if (iVar5 <= lVar7) {
      *ppData = local_70;
      return 0;
    }
    lVar3 = (long)local_74;
    if (pCArray->ixNx[lVar3] <= lVar7) {
      local_74 = local_74 + 1;
      local_60 = pCArray->apEnd[lVar3 + 1];
    }
    iFirst = iFirst + 1;
    pCellptr = (u8 *)((long)pCellptr + 2);
    lVar3 = lVar7;
  }
  sqlite3CorruptError(0x11279);
  return 1;
}

Assistant:

static int pageInsertArray(
  MemPage *pPg,                   /* Page to add cells to */
  u8 *pBegin,                     /* End of cell-pointer array */
  u8 **ppData,                    /* IN/OUT: Page content-area pointer */
  u8 *pCellptr,                   /* Pointer to cell-pointer area */
  int iFirst,                     /* Index of first cell to add */
  int nCell,                      /* Number of cells to add to pPg */
  CellArray *pCArray              /* Array of cells */
){
  int i = iFirst;                 /* Loop counter - cell index to insert */
  u8 *aData = pPg->aData;         /* Complete page */
  u8 *pData = *ppData;            /* Content area.  A subset of aData[] */
  int iEnd = iFirst + nCell;      /* End of loop. One past last cell to ins */
  int k;                          /* Current slot in pCArray->apEnd[] */
  u8 *pEnd;                       /* Maximum extent of cell data */
  assert( CORRUPT_DB || pPg->hdrOffset==0 );    /* Never called on page 1 */
  if( iEnd<=iFirst ) return 0;
  for(k=0; pCArray->ixNx[k]<=i && ALWAYS(k<NB*2); k++){}
  pEnd = pCArray->apEnd[k];
  while( 1 /*Exit by break*/ ){
    int sz, rc;
    u8 *pSlot;
    sz = cachedCellSize(pCArray, i);
    if( (aData[1]==0 && aData[2]==0) || (pSlot = pageFindSlot(pPg,sz,&rc))==0 ){
      if( (pData - pBegin)<sz ) return 1;
      pData -= sz;
      pSlot = pData;
    }
    /* pSlot and pCArray->apCell[i] will never overlap on a well-formed
    ** database.  But they might for a corrupt database.  Hence use memmove()
    ** since memcpy() sends SIGABORT with overlapping buffers on OpenBSD */
    assert( (pSlot+sz)<=pCArray->apCell[i]
         || pSlot>=(pCArray->apCell[i]+sz)
         || CORRUPT_DB );
    if( (uptr)(pCArray->apCell[i]+sz)>(uptr)pEnd
     && (uptr)(pCArray->apCell[i])<(uptr)pEnd
    ){
      assert( CORRUPT_DB );
      (void)SQLITE_CORRUPT_BKPT;
      return 1;
    }
    memmove(pSlot, pCArray->apCell[i], sz);
    put2byte(pCellptr, (pSlot - aData));
    pCellptr += 2;
    i++;
    if( i>=iEnd ) break;
    if( pCArray->ixNx[k]<=i ){
      k++;
      pEnd = pCArray->apEnd[k];
    }
  }
  *ppData = pData;
  return 0;
}